

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItem::setCacheMode(QGraphicsItem *this,CacheMode mode,QSize *logicalCacheSize)

{
  QGraphicsItemPrivate *pQVar1;
  QSize QVar2;
  ulong uVar3;
  QGraphicsItemCache *this_00;
  CacheMode CVar4;
  undefined4 uVar5;
  ulong uVar6;
  CacheMode CVar7;
  long in_FS_OFFSET;
  bool bVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar6 = *(ulong *)&pQVar1->field_0x160;
  uVar3 = uVar6 >> 0x15;
  CVar7 = (CacheMode)uVar3 & (DeviceCoordinateCache|ItemCoordinateCache);
  uVar6 = uVar6 & 0xffffffffff9fffff |
          (ulong)((mode & (DeviceCoordinateCache|ItemCoordinateCache)) << 0x15);
  *(ulong *)&pQVar1->field_0x160 = uVar6;
  if ((mode == NoCache && (uVar3 & 3) == 0) ||
     ((mode == NoCache && (CVar7 == DeviceCoordinateCache)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QGraphicsItemPrivate::removeExtraItemCache((this->d_ptr).d);
      return;
    }
    goto LAB_005daa3b;
  }
  if ((mode == DeviceCoordinateCache) && (bVar8 = true, (uVar3 & 3) == 0)) {
LAB_005da99f:
    uVar5 = (undefined4)uVar6;
    this_00 = QGraphicsItemPrivate::extraItemCache((this->d_ptr).d);
    QGraphicsItemCache::purge(this_00);
    if (mode == ItemCoordinateCache) {
      if (CVar7 == ItemCoordinateCache) {
        QVar2 = *logicalCacheSize;
        iVar10 = -(uint)(QVar2.wd.m_i.m_i == (this_00->fixedSize).wd.m_i);
        iVar11 = -(uint)(QVar2.ht.m_i.m_i == (this_00->fixedSize).ht.m_i);
        auVar9._4_4_ = iVar10;
        auVar9._0_4_ = iVar10;
        auVar9._8_4_ = iVar11;
        auVar9._12_4_ = iVar11;
        iVar10 = movmskpd(uVar5,auVar9);
        bVar8 = (bool)(iVar10 == 3 | bVar8);
        this_00->fixedSize = QVar2;
      }
      else {
        this_00->fixedSize = *logicalCacheSize;
      }
    }
    if (!bVar8) goto LAB_005daa04;
  }
  else {
    CVar4 = CVar7 ^ DeviceCoordinateCache | mode ^ DeviceCoordinateCache;
    uVar6 = (ulong)CVar4;
    bVar8 = CVar4 == NoCache;
    if (mode != NoCache) goto LAB_005da99f;
    QGraphicsItemPrivate::removeExtraItemCache((this->d_ptr).d);
LAB_005daa04:
    local_58.w = 0.0;
    local_58.h = 0.0;
    local_58.xp = 0.0;
    local_58.yp = 0.0;
    update(this,&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005daa3b:
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setCacheMode(CacheMode mode, const QSize &logicalCacheSize)
{
    CacheMode lastMode = CacheMode(d_ptr->cacheMode);
    d_ptr->cacheMode = mode;
    bool noVisualChange = (mode == NoCache && lastMode == NoCache)
                          || (mode == NoCache && lastMode == DeviceCoordinateCache)
                          || (mode == DeviceCoordinateCache && lastMode == NoCache)
                          || (mode == DeviceCoordinateCache && lastMode == DeviceCoordinateCache);
    if (mode == NoCache) {
        d_ptr->removeExtraItemCache();
    } else {
        QGraphicsItemCache *cache = d_ptr->extraItemCache();

        // Reset old cache
        cache->purge();

        if (mode == ItemCoordinateCache) {
            if (lastMode == mode && cache->fixedSize == logicalCacheSize)
                noVisualChange = true;
            cache->fixedSize = logicalCacheSize;
        }
    }
    if (!noVisualChange)
        update();
}